

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.h
# Opt level: O3

void pybind11::finalize_interpreter(void)

{
  PyTypeObject *pPVar1;
  internals *this;
  bool bVar2;
  object *poVar3;
  internals **ppiVar4;
  handle *this_00;
  char *id;
  handle builtins;
  handle local_50;
  handle local_48;
  item_accessor local_40;
  char *local_20;
  undefined8 local_18;
  
  local_18 = PyEval_GetBuiltins();
  ppiVar4 = detail::get_internals_pp()::internals_pp;
  local_20 = "__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__";
  bVar2 = detail::object_api<pybind11::handle>::contains<char_const*&>
                    ((object_api<pybind11::handle> *)&local_18,&local_20);
  if (bVar2) {
    detail::object_api<pybind11::handle>::operator[]
              (&local_40,(object_api<pybind11::handle> *)&local_18,local_20);
    poVar3 = detail::accessor<pybind11::detail::accessor_policies::generic_item>::get_cache
                       (&local_40);
    local_50.m_ptr = (poVar3->super_handle).m_ptr;
    if (local_50.m_ptr == (PyObject *)0x0) {
      this_00 = &local_50;
    }
    else {
      (local_50.m_ptr)->ob_refcnt = (local_50.m_ptr)->ob_refcnt + 1;
      pPVar1 = (local_50.m_ptr)->ob_type;
      object::~object((object *)&local_50);
      object::~object(&local_40.cache);
      object::~object(&local_40.key);
      if (pPVar1 != (PyTypeObject *)&PyCapsule_Type) goto LAB_001116da;
      detail::object_api<pybind11::handle>::operator[]
                (&local_40,(object_api<pybind11::handle> *)&local_18,local_20);
      poVar3 = detail::accessor<pybind11::detail::accessor_policies::generic_item>::get_cache
                         (&local_40);
      local_50.m_ptr = (poVar3->super_handle).m_ptr;
      if (local_50.m_ptr != (PyObject *)0x0) {
        (local_50.m_ptr)->ob_refcnt = (local_50.m_ptr)->ob_refcnt + 1;
      }
      local_48.m_ptr = (PyObject *)0x0;
      ppiVar4 = capsule::operator_cast_to_internals__((capsule *)&local_50);
      object::~object((object *)&local_50);
      this_00 = &local_48;
    }
    object::~object((object *)this_00);
    object::~object(&local_40.cache);
    object::~object(&local_40.key);
  }
LAB_001116da:
  Py_Finalize();
  if (ppiVar4 != (internals **)0x0) {
    this = *ppiVar4;
    if (this != (internals *)0x0) {
      detail::internals::~internals(this);
    }
    operator_delete(this,0x1d8);
    *ppiVar4 = (internals *)0x0;
  }
  return;
}

Assistant:

inline void finalize_interpreter() {
    handle builtins(PyEval_GetBuiltins());
    const char *id = PYBIND11_INTERNALS_ID;

    // Get the internals pointer (without creating it if it doesn't exist).  It's possible for the
    // internals to be created during Py_Finalize() (e.g. if a py::capsule calls `get_internals()`
    // during destruction), so we get the pointer-pointer here and check it after Py_Finalize().
    detail::internals **internals_ptr_ptr = detail::get_internals_pp();
    // It could also be stashed in builtins, so look there too:
    if (builtins.contains(id) && isinstance<capsule>(builtins[id]))
        internals_ptr_ptr = capsule(builtins[id]);

    Py_Finalize();

    if (internals_ptr_ptr) {
        delete *internals_ptr_ptr;
        *internals_ptr_ptr = nullptr;
    }
}